

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O1

Result __thiscall tonk::gateway::ParsedXML::Parse(ParsedXML *this,char *data,uint bytes)

{
  char cVar1;
  char *__s1;
  int iVar2;
  undefined4 extraout_var;
  char *extraout_RAX;
  uint in_ECX;
  undefined4 in_register_00000014;
  long lVar3;
  uint uVar4;
  uint uVar5;
  string *this_00;
  int iVar6;
  Result *success;
  ulong uVar7;
  ParsedXML *pPVar8;
  char *pcVar9;
  bool bVar10;
  string serviceType;
  string controlURL;
  string tagData;
  char *local_d8;
  long local_d0;
  char local_c8 [16];
  ParsedXML *local_b8;
  string *local_b0;
  ulong local_a8;
  undefined1 *local_a0;
  ulong local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  string *local_60;
  string *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  lVar3 = CONCAT44(in_register_00000014,bytes);
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  **(undefined1 **)data = 0;
  data[0x28] = '\0';
  data[0x29] = '\0';
  data[0x2a] = '\0';
  data[0x2b] = '\0';
  data[0x2c] = '\0';
  data[0x2d] = '\0';
  data[0x2e] = '\0';
  data[0x2f] = '\0';
  **(undefined1 **)(data + 0x20) = 0;
  data[0x48] = '\0';
  data[0x49] = '\0';
  data[0x4a] = '\0';
  data[0x4b] = '\0';
  data[0x4c] = '\0';
  data[0x4d] = '\0';
  data[0x4e] = '\0';
  data[0x4f] = '\0';
  **(undefined1 **)(data + 0x40) = 0;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = local_70;
  local_78 = 0;
  local_70[0] = 0;
  local_b8 = this;
  local_b0 = (string *)data;
  if (in_ECX != 0) {
    local_58 = (string *)(data + 0x20);
    local_60 = (string *)(data + 0x40);
    uVar7 = 0;
    uVar4 = 0;
    uVar5 = 0;
    local_a8 = 0;
    do {
      iVar6 = (int)uVar7;
      if (uVar4 == 0) {
        uVar4 = iVar6 + 1;
        if (*(char *)(lVar3 + uVar7) != '<') {
          uVar4 = 0;
        }
      }
      else if (*(char *)(lVar3 + uVar7) == '>') {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,(ulong)uVar4 + lVar3,
                   (ulong)(iVar6 - uVar4) + (ulong)uVar4 + lVar3);
        cVar1 = *local_50[0];
        pcVar9 = local_50[0];
        if ((cVar1 == '/') && (pcVar9 = local_50[0] + 1, uVar5 < uVar4)) {
          if ((local_a8 & 1) == 0) {
            iVar2 = strcasecmp(pcVar9,"URLBase");
            if (iVar2 != 0) goto LAB_001590c0;
            local_d8 = local_c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,(ulong)uVar5 + lVar3,
                       (ulong)(uVar4 + ~uVar5) + (ulong)uVar5 + lVar3);
            this_00 = local_b0;
          }
          else {
            iVar2 = strcasecmp(pcVar9,"serviceType");
            if (iVar2 == 0) {
              local_d8 = local_c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,(ulong)uVar5 + lVar3,
                         (ulong)(uVar4 + ~uVar5) + (ulong)uVar5 + lVar3);
              this_00 = (string *)&local_a0;
            }
            else {
              iVar2 = strcasecmp(pcVar9,"controlURL");
              if (iVar2 != 0) goto LAB_001590c0;
              local_d8 = local_c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,(ulong)uVar5 + lVar3,
                         (ulong)(uVar4 + ~uVar5) + (ulong)uVar5 + lVar3);
              this_00 = (string *)&local_80;
            }
          }
          std::__cxx11::string::operator=(this_00,(string *)&local_d8);
          if (local_d8 != local_c8) {
            operator_delete(local_d8);
          }
        }
LAB_001590c0:
        iVar2 = strcasecmp(pcVar9,"service");
        pcVar9 = (char *)CONCAT44(extraout_var,iVar2);
        if (iVar2 == 0) {
          if ((cVar1 == '/') && (2 < local_98)) {
            std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_a0);
            __s1 = local_d8;
            iVar2 = strcasecmp(local_d8,"urn:schemas-upnp-org:service:WANIPConnection");
            if (iVar2 == 0) {
              bVar10 = true;
            }
            else {
              iVar2 = strcasecmp(__s1,"urn:schemas-upnp-org:service:WANPPPConnection");
              bVar10 = iVar2 == 0;
            }
            pcVar9 = local_c8;
            if (__s1 != pcVar9) {
              operator_delete(__s1);
              pcVar9 = extraout_RAX;
            }
            if (bVar10) {
              std::__cxx11::string::_M_assign(local_58);
              pcVar9 = (char *)std::__cxx11::string::_M_assign(local_60);
            }
          }
          local_a8 = CONCAT71((int7)((ulong)pcVar9 >> 8),cVar1 != '/');
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        uVar5 = iVar6 + 1;
        uVar4 = 0;
      }
      uVar7 = uVar7 + 1;
    } while (in_ECX != uVar7);
  }
  if (*(long *)(local_b0 + 0x28) == 0) {
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Unable to find ServiceType","");
    pcVar9 = (char *)operator_new(0x38);
    pPVar8 = local_b8;
    pcVar9[0] = '\0';
    pcVar9[1] = '\0';
    pcVar9[2] = '\0';
    pcVar9[3] = '\0';
    pcVar9[4] = '\0';
    pcVar9[5] = '\0';
    pcVar9[6] = '\0';
    pcVar9[7] = '\0';
    *(char **)(pcVar9 + 8) = pcVar9 + 0x18;
    std::__cxx11::string::_M_construct<char*>((string *)(pcVar9 + 8),local_d8,local_d8 + local_d0);
  }
  else {
    if (*(long *)(local_b0 + 0x48) != 0) {
      (local_b8->URLBase)._M_dataplus._M_p = (char *)0x0;
      pPVar8 = local_b8;
      goto LAB_00159332;
    }
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Unable to find ControlURL","");
    pPVar8 = local_b8;
    pcVar9 = (char *)operator_new(0x38);
    pcVar9[0] = '\0';
    pcVar9[1] = '\0';
    pcVar9[2] = '\0';
    pcVar9[3] = '\0';
    pcVar9[4] = '\0';
    pcVar9[5] = '\0';
    pcVar9[6] = '\0';
    pcVar9[7] = '\0';
    *(char **)(pcVar9 + 8) = pcVar9 + 0x18;
    std::__cxx11::string::_M_construct<char*>((string *)(pcVar9 + 8),local_d8,local_d8 + local_d0);
  }
  pcVar9[0x28] = '\0';
  pcVar9[0x29] = '\0';
  pcVar9[0x2a] = '\0';
  pcVar9[0x2b] = '\0';
  pcVar9[0x30] = '\x02';
  pcVar9[0x31] = '\0';
  pcVar9[0x32] = '\0';
  pcVar9[0x33] = '\0';
  pcVar9[0x34] = '\0';
  pcVar9[0x35] = '\0';
  pcVar9[0x36] = '\0';
  pcVar9[0x37] = '\0';
  (pPVar8->URLBase)._M_dataplus._M_p = pcVar9;
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
LAB_00159332:
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return (Result)(ErrorResult *)pPVar8;
}

Assistant:

Result ParsedXML::Parse(const char* data, unsigned bytes)
{
    URLBase.clear();
    ServiceType.clear();
    ControlURL.clear();

    unsigned tag_start = 0, data_start = 0;
    bool inService = false;
    std::string serviceType, controlURL;

    for (unsigned i = 0; i < bytes; ++i)
    {
        char ch = data[i];
        if (tag_start != 0)
        {
            if (ch == '>')
            {
                std::string tagData(data + tag_start, i - tag_start);
                const char* tag = tagData.c_str();
                bool end = (tag[0] == '/');

                if (end)
                {
                    ++tag;
                    if (tag_start > data_start)
                    {
                        if (inService)
                        {
                            if (0 == StrCaseCompare(tag, "serviceType")) {
                                serviceType = std::string(data + data_start, tag_start - data_start - 1);
                            }
                            else if (0 == StrCaseCompare(tag, "controlURL")) {
                                controlURL = std::string(data + data_start, tag_start - data_start - 1);
                            }
                        }
                        else if (0 == StrCaseCompare(tag, "URLBase")) {
                            URLBase = std::string(data + data_start, tag_start - data_start - 1);
                        }
                    }
                }

                if (0 == StrCaseCompare(tag, "service"))
                {
                    if (end && IsWANConnectionServiceType(serviceType))
                    {
                        ServiceType = serviceType;
                        ControlURL = controlURL;
                    }
                    inService = !end;
                }

                tag_start = 0;
                data_start = i + 1;
            }
        }
        else if (ch == '<') {
            tag_start = i + 1;
        }
    }

    if (ServiceType.empty()) {
        return Result("Unable to find ServiceType");
    }
    if (ControlURL.empty()) {
        return Result("Unable to find ControlURL");
    }
    return Result::Success();
}